

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVDB.h
# Opt level: O2

ValueType * __thiscall
nanovdb::
ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
::getValue(ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
           *this,CoordType *ijk)

{
  void *pvVar1;
  uint uVar2;
  uint32_t uVar3;
  ValueType *pVVar4;
  ValueType *pVVar5;
  ValueType *pVVar6;
  
  uVar2 = computeDirty(this,ijk);
  pvVar1 = this->mNode[0];
  if (pvVar1 != (void *)0x0) {
    if (uVar2 < 8) {
      uVar3 = LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>::CoordToOffset(ijk);
      return (ValueType *)((long)pvVar1 + (ulong)uVar3 * 4 + 0x40);
    }
    this->mNode[0] = (void *)0x0;
  }
  if ((InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u> *)this->mNode[1] !=
      (InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u> *)0x0) {
    if (uVar2 < 0x80) {
      pVVar4 = InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>::
               getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                         ((InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>
                           *)this->mNode[1],ijk,this);
      return pVVar4;
    }
    this->mNode[1] = (void *)0x0;
  }
  if ((InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
       *)this->mNode[2] !=
      (InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
       *)0x0) {
    if (uVar2 < 0x1000) {
      pVVar5 = InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
               ::
               getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                         ((InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>
                           *)this->mNode[2],ijk,this);
      return pVVar5;
    }
    this->mNode[2] = (void *)0x0;
  }
  pVVar6 = RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
           ::
           getValueAndCache<nanovdb::ReadAccessor<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
                     ((RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>
                       *)this->mNode[3],ijk,this);
  return pVVar6;
}

Assistant:

__hostdev__ const ValueType& getValue(const CoordType& ijk) const
    {
#ifdef USE_SINGLE_ACCESSOR_KEY
        const CoordValueType dirty = this->computeDirty(ijk);
#else
        auto&& dirty = ijk;
#endif
        if (this->isCached<NodeT0>(dirty)) {
            return ((NodeT0*)mNode[0])->getValue(ijk);
        } else if (this->isCached<NodeT1>(dirty)) {
            return ((NodeT1*)mNode[1])->getValueAndCache(ijk, *this);
        } else if (this->isCached<NodeT2>(dirty)) {
            return ((NodeT2*)mNode[2])->getValueAndCache(ijk, *this);
        }
        return ((NodeT3*)mNode[3])->getValueAndCache(ijk, *this);
    }